

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# camera.cc
# Opt level: O3

void __thiscall
gmath::OrthoCamera::reconstructPoint(OrthoCamera *this,Vector3d *Pw,Vector2d *p,double d)

{
  double dVar1;
  int i_1;
  Matrix33d *pMVar2;
  InvalidArgumentException *this_00;
  int k;
  long lVar3;
  long lVar4;
  SVector<double,_3> ret;
  SVector<double,_3> ret_1;
  string local_78;
  double local_58 [4];
  double local_38 [3];
  
  if ((ulong)ABS(d) < 0x7ff0000000000000) {
    local_78._M_dataplus._M_p = (pointer)(this->res * *(double *)p);
    local_78._M_string_length = (size_type)(this->res * -*(double *)(p + 8));
    local_78.field_2._M_allocated_capacity = (size_type)(d * this->dres);
    pMVar2 = &(this->super_Camera).R;
    local_58[0] = 0.0;
    local_58[1] = 0.0;
    local_58[2] = 0.0;
    lVar3 = 0;
    do {
      dVar1 = local_58[lVar3];
      lVar4 = 0;
      do {
        dVar1 = dVar1 + pMVar2->v[0][lVar4] * (double)(&local_78._M_dataplus)[lVar4]._M_p;
        lVar4 = lVar4 + 1;
      } while (lVar4 != 3);
      local_58[lVar3] = dVar1;
      lVar3 = lVar3 + 1;
      pMVar2 = (Matrix33d *)(pMVar2->v + 1);
    } while (lVar3 != 3);
    local_38[0] = 0.0;
    local_38[1] = 0.0;
    local_38[2] = 0.0;
    lVar3 = 0;
    do {
      local_38[lVar3] = local_58[lVar3] + (this->super_Camera).T.v[lVar3];
      lVar3 = lVar3 + 1;
    } while (lVar3 != 3);
    Pw->v[2] = local_38[2];
    Pw->v[0] = local_38[0];
    Pw->v[1] = local_38[1];
    return;
  }
  this_00 = (InvalidArgumentException *)__cxa_allocate_exception(0x28);
  local_78._M_dataplus._M_p = (pointer)&local_78.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_78,"Cannot reconstruct invalid point","");
  gutil::InvalidArgumentException::InvalidArgumentException(this_00,&local_78);
  __cxa_throw(this_00,&gutil::InvalidArgumentException::typeinfo,gutil::Exception::~Exception);
}

Assistant:

void OrthoCamera::reconstructPoint(Vector3d &Pw, const Vector2d &p, double d)
const
{
  if (!std::isfinite(d))
  {
    throw gutil::InvalidArgumentException("Cannot reconstruct invalid point");
  }

  Vector3d Pc;

  Pc[0]=p[0]*res;
  Pc[1]=-p[1]*res;
  Pc[2]=d*dres;

  Pw=getR()*Pc+getT();
}